

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ExtensionSet::RemoveLast(ExtensionSet *this,int number)

{
  byte bVar1;
  undefined8 *puVar2;
  int iVar3;
  _Rb_tree_color _Var4;
  _Base_ptr p_Var5;
  LogMessage *pLVar6;
  _Rb_tree_header *p_Var7;
  _Base_ptr p_Var8;
  LogFinisher local_51;
  LogMessage local_50;
  
  p_Var5 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  p_Var8 = &p_Var7->_M_header;
  if (p_Var5 == (_Base_ptr)0x0) {
LAB_005d7a9b:
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x303);
    pLVar6 = LogMessage::operator<<(&local_50,"CHECK failed: iter != extensions_.end(): ");
    pLVar6 = LogMessage::operator<<(pLVar6,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_51,pLVar6);
    LogMessage::~LogMessage(&local_50);
    p_Var8 = &p_Var7->_M_header;
  }
  else {
    do {
      if (number <= (int)p_Var5[1]._M_color) {
        p_Var8 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < number];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var8 == p_Var7) || (number < (int)p_Var8[1]._M_color))
    goto LAB_005d7a9b;
  }
  if (*(char *)((long)&p_Var8[1]._M_left + 1) == '\0') {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x306);
    pLVar6 = LogMessage::operator<<(&local_50,"CHECK failed: extension->is_repeated: ");
    LogFinisher::operator=(&local_51,pLVar6);
    LogMessage::~LogMessage(&local_50);
  }
  bVar1 = *(byte *)&p_Var8[1]._M_left;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x34);
    pLVar6 = LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_51,pLVar6);
    LogMessage::~LogMessage(&local_50);
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4)) {
  case 1:
    p_Var5 = p_Var8[1]._M_parent;
    _Var4 = p_Var5->_M_color;
    if ((int)_Var4 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar6 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar6);
LAB_005d7e87:
      LogMessage::~LogMessage(&local_50);
      _Var4 = p_Var5->_M_color;
    }
    break;
  case 2:
    p_Var5 = p_Var8[1]._M_parent;
    _Var4 = p_Var5->_M_color;
    if ((int)_Var4 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar6 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar6);
      goto LAB_005d7e87;
    }
    break;
  case 3:
    p_Var5 = p_Var8[1]._M_parent;
    _Var4 = p_Var5->_M_color;
    if ((int)_Var4 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar6 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar6);
      goto LAB_005d7e87;
    }
    break;
  case 4:
    p_Var5 = p_Var8[1]._M_parent;
    _Var4 = p_Var5->_M_color;
    if ((int)_Var4 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar6 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar6);
      goto LAB_005d7e87;
    }
    break;
  case 5:
    p_Var5 = p_Var8[1]._M_parent;
    _Var4 = p_Var5->_M_color;
    if ((int)_Var4 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar6 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar6);
      goto LAB_005d7e87;
    }
    break;
  case 6:
    p_Var5 = p_Var8[1]._M_parent;
    _Var4 = p_Var5->_M_color;
    if ((int)_Var4 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar6 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar6);
      goto LAB_005d7e87;
    }
    break;
  case 7:
    p_Var5 = p_Var8[1]._M_parent;
    _Var4 = p_Var5->_M_color;
    if ((int)_Var4 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar6 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar6);
      goto LAB_005d7e87;
    }
    break;
  case 8:
    p_Var5 = p_Var8[1]._M_parent;
    _Var4 = p_Var5->_M_color;
    if ((int)_Var4 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x496);
      pLVar6 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar6);
      goto LAB_005d7e87;
    }
    break;
  case 9:
    p_Var5 = p_Var8[1]._M_parent;
    iVar3 = *(int *)&p_Var5->_M_parent;
    if (iVar3 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x603);
      pLVar6 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar6);
      LogMessage::~LogMessage(&local_50);
      iVar3 = *(int *)&p_Var5->_M_parent;
    }
    *(int *)&p_Var5->_M_parent = iVar3 + -1;
    puVar2 = *(undefined8 **)(&p_Var5->_M_left->_M_color + (long)iVar3 * 2);
    puVar2[1] = 0;
    *(undefined1 *)*puVar2 = 0;
    return;
  case 10:
    p_Var5 = p_Var8[1]._M_parent;
    iVar3 = *(int *)&p_Var5->_M_parent;
    if (iVar3 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x603);
      pLVar6 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar6);
      LogMessage::~LogMessage(&local_50);
      iVar3 = *(int *)&p_Var5->_M_parent;
    }
    *(int *)&p_Var5->_M_parent = iVar3 + -1;
    (**(code **)(**(long **)(&p_Var5->_M_left->_M_color + (long)iVar3 * 2) + 0x38))();
  default:
    goto switchD_005d7bb1_default;
  }
  p_Var5->_M_color = _Var4 - _S_black;
switchD_005d7bb1_default:
  return;
}

Assistant:

void ExtensionSet::RemoveLast(int number) {
  ExtensionMap::iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";

  Extension* extension = &iter->second;
  GOOGLE_DCHECK(extension->is_repeated);

  switch(cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->RemoveLast();
      break;
  }
}